

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O0

RK_S32 find_dir_in_path(char *path,char *dir_name,size_t max_length)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_30;
  RK_S32 n;
  RK_S32 new_path_len;
  RK_S32 path_len;
  dirent **dir;
  size_t max_length_local;
  char *dir_name_local;
  char *path_local;
  
  dir = (dirent **)max_length;
  max_length_local = (size_t)dir_name;
  dir_name_local = path;
  sVar3 = strnlen(path,max_length);
  iVar1 = (int)sVar3;
  local_30 = 0;
  pthread_once(&once,scandir_lock_init);
  pthread_mutex_lock((pthread_mutex_t *)&scandir_lock);
  search_name = (char *)max_length_local;
  iVar2 = scandir64(dir_name_local,(dirent64 ***)&new_path_len,_compare_name,alphasort64);
  if (iVar2 < 1) {
    _mpp_log_l(4,"mpp_ion","scan %s for %s return %d\n",(char *)0x0,dir_name_local,max_length_local,
               iVar2);
  }
  else {
    if ((iVar2 != 1) &&
       (_mpp_log_l(2,"mpp_ion","Assertion %s failed at %s:%d\n",(char *)0x0,"n == 1",
                   "find_dir_in_path",0xc1), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    local_30 = snprintf(dir_name_local + iVar1,(long)dir + (-1 - (long)iVar1),"/%s",
                        (*_new_path_len)->d_name);
    local_30 = local_30 + iVar1;
    free(*_new_path_len);
    free(_new_path_len);
  }
  search_name = (char *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&scandir_lock);
  return local_30;
}

Assistant:

static RK_S32 find_dir_in_path(char *path, const char *dir_name,
                               size_t max_length)
{
    struct dirent **dir;
    RK_S32 path_len = strnlen(path, max_length);
    RK_S32 new_path_len = 0;
    RK_S32 n;

    pthread_once(&once, scandir_lock_init);
    pthread_mutex_lock(&scandir_lock);
    search_name = dir_name;
    n = scandir(path, &dir, _compare_name, alphasort);
    if (n <= 0) {
        mpp_log("scan %s for %s return %d\n", path, dir_name, n);
    } else {
        mpp_assert(n == 1);

        new_path_len = path_len;
        new_path_len += snprintf(path + path_len, max_length - path_len - 1,
                                 "/%s", dir[0]->d_name);
        free(dir[0]);
        free(dir);
    }
    search_name = NULL;
    pthread_mutex_unlock(&scandir_lock);
    return new_path_len;
}